

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrtf.cpp
# Opt level: O0

vector<std::string> * EnumerateHrtf_abi_cxx11_(char *devname)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  iterator dispname;
  iterator iVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
  __first;
  undefined8 uVar5;
  vector<std::string> *in_RDI;
  span<const_char,_18446744073709551615UL> sVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
  iter;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  defhrtfopt;
  HrtfEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<HrtfEntry> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fname_1;
  iterator __end2;
  iterator __begin2;
  vector<std::string> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fname;
  iterator __end4;
  iterator __begin4;
  vector<std::string> *__range4;
  string pname;
  char *end;
  char *next;
  char *pathlist;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pathopt
  ;
  bool usedefaults;
  lock_guard<std::mutex> _;
  vector<std::string> *list;
  mutex_type *in_stack_fffffffffffffd58;
  FILE *in_stack_fffffffffffffd60;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd68;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
  in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
  in_stack_fffffffffffffd80;
  pointer in_stack_fffffffffffffd88;
  pointer in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffdb8;
  undefined6 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc6;
  undefined1 in_stack_fffffffffffffdc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  optional local_1b0 [16];
  undefined8 in_stack_fffffffffffffe60;
  __normal_iterator<(anonymous_namespace)::HrtfEntry_*,_std::vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>_>
  local_178;
  undefined1 *local_170;
  undefined1 local_162;
  undefined1 local_161 [33];
  span<const_char,_18446744073709551615UL> local_140;
  reference local_130;
  ALuint residx;
  undefined1 local_118 [24];
  undefined1 *local_100;
  reference local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
  local_e8;
  undefined1 local_e0 [24];
  undefined1 *local_c8;
  allocator<char> local_b9;
  string local_b8 [8];
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *local_98;
  char *local_90;
  char *local_88;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  byte local_19;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::
  vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>::
  clear((vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
         *)0x1f6967);
  local_19 = 1;
  ConfigValueStr_abi_cxx11_
            ((char *)in_stack_fffffffffffffdc8,
             (char *)CONCAT17(in_stack_fffffffffffffdc7,
                              CONCAT16(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0)),
             in_stack_fffffffffffffdb8);
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<true,_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffd70._M_current,in_stack_fffffffffffffd68);
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffd60);
  bVar1 = al::optional::operator_cast_to_bool((optional *)&local_48);
  if (bVar1) {
    in_stack_fffffffffffffdc8 =
         al::
         optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator->(&local_48);
    local_88 = (char *)std::__cxx11::string::c_str();
    while( true ) {
      bVar1 = false;
      if (local_88 != (char *)0x0) {
        bVar1 = *local_88 != '\0';
      }
      if (!bVar1) break;
      while( true ) {
        iVar2 = isspace((int)*local_88);
        in_stack_fffffffffffffdc6 = true;
        if (iVar2 == 0) {
          in_stack_fffffffffffffdc6 = *local_88 == ',';
        }
        if ((bool)in_stack_fffffffffffffdc6 == false) break;
        local_88 = local_88 + 1;
      }
      if (*local_88 != '\0') {
        local_98 = strchr(local_88,0x2c);
        if (local_98 == (char *)0x0) {
          in_stack_fffffffffffffdb8 = local_88;
          sVar3 = strlen(local_88);
          local_98 = in_stack_fffffffffffffdb8 + sVar3;
          local_19 = 0;
          local_90 = (char *)0x0;
        }
        else {
          local_90 = local_98 + 1;
        }
        while( true ) {
          bVar1 = false;
          if (local_98 != local_88) {
            iVar2 = isspace((int)local_98[-1]);
            bVar1 = iVar2 != 0;
          }
          if (!bVar1) break;
          local_98 = local_98 + -1;
        }
        if (local_98 != local_88) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    (in_stack_fffffffffffffd80._M_current,in_stack_fffffffffffffd78,
                     (char *)in_stack_fffffffffffffd70._M_current,
                     (allocator<char> *)in_stack_fffffffffffffd68);
          std::allocator<char>::~allocator(&local_b9);
          std::__cxx11::string::c_str();
          SearchDataFiles_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
          local_c8 = local_e0;
          local_e8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                        *)in_stack_fffffffffffffd58);
          local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                            *)in_stack_fffffffffffffd58);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                                     *)in_stack_fffffffffffffd60,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                                     *)in_stack_fffffffffffffd58), bVar1) {
            local_f8 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                       ::operator*(&local_e8);
            anon_unknown.dwarf_189523::AddFileEntry((string *)in_stack_fffffffffffffe60);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
            ::operator++(&local_e8);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                     *)in_stack_fffffffffffffd70._M_current);
          std::__cxx11::string::~string(local_b8);
        }
        local_88 = local_90;
      }
    }
    in_stack_fffffffffffffdc7 = 0;
  }
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffd60);
  sVar6.mDataEnd = in_stack_fffffffffffffd88;
  sVar6.mData = in_stack_fffffffffffffd90;
  if ((local_19 & 1) != 0) {
    SearchDataFiles_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    local_100 = local_118;
    dispname = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                        *)in_stack_fffffffffffffd58);
    iVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   *)in_stack_fffffffffffffd58);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                          *)in_stack_fffffffffffffd60,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                          *)in_stack_fffffffffffffd58);
      residx = (ALuint)((ulong)iVar4._M_current >> 0x20);
      if (!bVar1) break;
      local_130 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                  ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                               *)&stack0xfffffffffffffee0);
      anon_unknown.dwarf_189523::AddFileEntry((string *)in_stack_fffffffffffffe60);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
      ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                    *)&stack0xfffffffffffffee0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
               *)in_stack_fffffffffffffd70._M_current);
    sVar6 = anon_unknown.dwarf_189523::GetResource(0);
    local_140 = sVar6;
    bVar1 = al::span<const_char,_18446744073709551615UL>::empty(&local_140);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffd80._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_161;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_161 + 1),"Built-In HRTF",
                 (allocator *)in_stack_fffffffffffffd80._M_current);
      anon_unknown.dwarf_189523::AddBuiltInEntry(dispname._M_current,residx);
      std::__cxx11::string::~string((string *)(local_161 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_161);
    }
  }
  local_162 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
            *)0x1f6f82);
  std::
  vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>::
  size((vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
        *)(anonymous_namespace)::EnumeratedHrtfs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             *)sVar6.mData,(size_type)sVar6.mDataEnd);
  local_170 = (anonymous_namespace)::EnumeratedHrtfs;
  local_178._M_current =
       (HrtfEntry *)
       std::
       vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
       ::begin((vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
                *)in_stack_fffffffffffffd58);
  std::
  vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>::
  end((vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>
       *)in_stack_fffffffffffffd58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<(anonymous_namespace)::HrtfEntry_*,_std::vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>_>
                        *)in_stack_fffffffffffffd60,
                       (__normal_iterator<(anonymous_namespace)::HrtfEntry_*,_std::vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>_>
                        *)in_stack_fffffffffffffd58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::HrtfEntry_*,_std::vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>_>
    ::operator*(&local_178);
    std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                *)in_stack_fffffffffffffd70._M_current,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd68);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::HrtfEntry_*,_std::vector<(anonymous_namespace)::HrtfEntry,_al::allocator<(anonymous_namespace)::HrtfEntry,_8UL>_>_>
    ::operator++(&local_178);
  }
  ConfigValueStr_abi_cxx11_
            ((char *)in_stack_fffffffffffffdc8,
             (char *)CONCAT17(in_stack_fffffffffffffdc7,
                              CONCAT16(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0)),
             in_stack_fffffffffffffdb8);
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<true,_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffd70._M_current,in_stack_fffffffffffffd68);
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffd60);
  bVar1 = al::optional::operator_cast_to_bool(local_1b0);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
             *)in_stack_fffffffffffffd58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
           *)in_stack_fffffffffffffd58);
    __first._M_current =
         al::
         optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1b0);
    std::
    find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>>,std::__cxx11::string>
              (__first,in_stack_fffffffffffffd70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
           *)in_stack_fffffffffffffd58);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                        *)in_stack_fffffffffffffd60,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                        *)in_stack_fffffffffffffd58);
    if (bVar1) {
      if (1 < (int)gLogLevel) {
        in_stack_fffffffffffffd60 = (FILE *)gLogFile;
        al::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1b0);
        uVar5 = std::__cxx11::string::c_str();
        fprintf(in_stack_fffffffffffffd60,"[ALSOFT] (WW) Failed to find default HRTF \"%s\"\n",uVar5
               );
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
               *)in_stack_fffffffffffffd58);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                          *)in_stack_fffffffffffffd60,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                          *)in_stack_fffffffffffffd58);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                 *)in_stack_fffffffffffffd58);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
        ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>_>
                     *)in_stack_fffffffffffffd68,(difference_type)in_stack_fffffffffffffd60);
        std::_V2::
        rotate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,al::allocator<std::__cxx11::string,8ul>>>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   sVar6.mDataEnd,in_stack_fffffffffffffd80,__first);
      }
    }
  }
  al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffffd60);
  local_162 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f72bc);
  return in_RDI;
}

Assistant:

al::vector<std::string> EnumerateHrtf(const char *devname)
{
    std::lock_guard<std::mutex> _{EnumeratedHrtfLock};
    EnumeratedHrtfs.clear();

    bool usedefaults{true};
    if(auto pathopt = ConfigValueStr(devname, nullptr, "hrtf-paths"))
    {
        const char *pathlist{pathopt->c_str()};
        while(pathlist && *pathlist)
        {
            const char *next, *end;

            while(isspace(*pathlist) || *pathlist == ',')
                pathlist++;
            if(*pathlist == '\0')
                continue;

            next = strchr(pathlist, ',');
            if(next)
                end = next++;
            else
            {
                end = pathlist + strlen(pathlist);
                usedefaults = false;
            }

            while(end != pathlist && isspace(*(end-1)))
                --end;
            if(end != pathlist)
            {
                const std::string pname{pathlist, end};
                for(const auto &fname : SearchDataFiles(".mhr", pname.c_str()))
                    AddFileEntry(fname);
            }

            pathlist = next;
        }
    }

    if(usedefaults)
    {
        for(const auto &fname : SearchDataFiles(".mhr", "openal/hrtf"))
            AddFileEntry(fname);

        if(!GetResource(IDR_DEFAULT_HRTF_MHR).empty())
            AddBuiltInEntry("Built-In HRTF", IDR_DEFAULT_HRTF_MHR);
    }

    al::vector<std::string> list;
    list.reserve(EnumeratedHrtfs.size());
    for(auto &entry : EnumeratedHrtfs)
        list.emplace_back(entry.mDispName);

    if(auto defhrtfopt = ConfigValueStr(devname, nullptr, "default-hrtf"))
    {
        auto iter = std::find(list.begin(), list.end(), *defhrtfopt);
        if(iter == list.end())
            WARN("Failed to find default HRTF \"%s\"\n", defhrtfopt->c_str());
        else if(iter != list.begin())
            std::rotate(list.begin(), iter, iter+1);
    }

    return list;
}